

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_cast.hpp
# Opt level: O2

double duckdb::HandleVectorCastError::Operation<double>
                 (string *error_message,ValidityMask *mask,idx_t idx,VectorTryCastData *cast_data)

{
  HandleCastError::AssignError(error_message,cast_data->parameters);
  cast_data->all_converted = false;
  TemplatedValidityMask<unsigned_long>::SetInvalid
            (&mask->super_TemplatedValidityMask<unsigned_long>,idx);
  return NAN;
}

Assistant:

static RESULT_TYPE Operation(const string &error_message, ValidityMask &mask, idx_t idx,
	                             VectorTryCastData &cast_data) {
		HandleCastError::AssignError(error_message, cast_data.parameters);
		cast_data.all_converted = false;
		mask.SetInvalid(idx);
		return NullValue<RESULT_TYPE>();
	}